

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O2

void __thiscall CTilesetMapper::Load(CTilesetMapper *this,json_value *rElement)

{
  long lVar1;
  int iVar2;
  _json_value *p_Var3;
  _json_value *p_Var4;
  _json_value *p_Var5;
  uint uVar6;
  uint k;
  uint index;
  EVP_PKEY_CTX *ctx;
  char *item;
  uint index_00;
  uint index_01;
  long in_FS_OFFSET;
  CRuleCondition local_104;
  CRule local_f8;
  CRuleSet local_d0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (index_01 = 0; index_01 < (rElement->u).string.length; index_01 = index_01 + 1) {
    ctx = (EVP_PKEY_CTX *)(ulong)index_01;
    p_Var3 = _json_value::operator[](rElement,index_01);
    if ((p_Var3->u).boolean == 1) {
      array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::init
                (&local_d0.m_aRules,ctx);
      p_Var3 = _json_value::operator[](rElement,index_01);
      str_copy(local_d0.m_aName,((p_Var3->u).object.values)->name,0x80);
      p_Var3 = _json_value::operator[](rElement,index_01);
      p_Var3 = ((p_Var3->u).object.values)->value;
      p_Var4 = _json_value::operator[](p_Var3,"basetile");
      local_d0.m_BaseTile = 1;
      if (p_Var4->type == json_integer) {
        local_d0.m_BaseTile = (p_Var4->u).boolean;
        if (0xfe < local_d0.m_BaseTile) {
          local_d0.m_BaseTile = 0xff;
        }
        if (local_d0.m_BaseTile < 1) {
          local_d0.m_BaseTile = 0;
        }
      }
      item = "rules";
      p_Var3 = _json_value::operator[](p_Var3,"rules");
      for (index_00 = 0; (index_00 < 0x100 && (index_00 < (p_Var3->u).string.length));
          index_00 = index_00 + 1) {
        array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>::
        init(&local_f8.m_aConditions,(EVP_PKEY_CTX *)item);
        p_Var4 = _json_value::operator[](p_Var3,index_00);
        p_Var4 = _json_value::operator[](p_Var4,"index");
        local_f8.m_Index = 1;
        if (p_Var4->type == json_integer) {
          local_f8.m_Index = (p_Var4->u).boolean;
          if (0xfe < local_f8.m_Index) {
            local_f8.m_Index = 0xff;
          }
          if (local_f8.m_Index < 1) {
            local_f8.m_Index = 0;
          }
        }
        p_Var4 = _json_value::operator[](p_Var3,index_00);
        p_Var4 = _json_value::operator[](p_Var4,"random");
        iVar2 = 0;
        local_f8.m_Random = 0;
        if (p_Var4->type == json_integer) {
          local_f8.m_Random = (p_Var4->u).boolean;
          if (0x1869e < local_f8.m_Random) {
            local_f8.m_Random = 99999;
          }
          if (local_f8.m_Random < 1) {
            local_f8.m_Random = 0;
          }
        }
        p_Var4 = _json_value::operator[](p_Var3,index_00);
        p_Var4 = _json_value::operator[](p_Var4,"rotate");
        if ((p_Var4->type == json_integer) &&
           (((lVar1 = (p_Var4->u).integer, lVar1 == 0x5a || (lVar1 == 0x10e)) || (lVar1 == 0xb4))))
        {
          iVar2 = (int)lVar1;
        }
        local_f8.m_Rotation = iVar2;
        p_Var4 = _json_value::operator[](p_Var3,index_00);
        p_Var4 = _json_value::operator[](p_Var4,"hflip");
        local_f8.m_HFlip = (int)(0 < (int)(p_Var4->u).integer && p_Var4->type == json_integer);
        p_Var4 = _json_value::operator[](p_Var3,index_00);
        p_Var4 = _json_value::operator[](p_Var4,"vflip");
        local_f8.m_VFlip = (int)(0 < (int)(p_Var4->u).integer && p_Var4->type == json_integer);
        p_Var4 = _json_value::operator[](p_Var3,index_00);
        p_Var4 = _json_value::operator[](p_Var4,"condition");
        if (p_Var4->type == json_array) {
          for (index = 0; index < (p_Var4->u).string.length; index = index + 1) {
            p_Var5 = _json_value::operator[](p_Var4,index);
            p_Var5 = _json_value::operator[](p_Var5,"x");
            local_104.m_X = (p_Var5->u).boolean;
            p_Var5 = _json_value::operator[](p_Var4,index);
            p_Var5 = _json_value::operator[](p_Var5,"y");
            local_104.m_Y = (p_Var5->u).boolean;
            p_Var5 = _json_value::operator[](p_Var4,index);
            p_Var5 = _json_value::operator[](p_Var5,"value");
            if (p_Var5->type == json_integer) {
              uVar6 = (p_Var5->u).boolean;
              if (0xfe < (int)uVar6) {
                uVar6 = 0xff;
              }
              if ((int)uVar6 < -1) {
                uVar6 = 0xfffffffe;
              }
            }
            else {
              uVar6 = 0xfffffffe;
              if (p_Var5->type == json_string) {
                iVar2 = str_comp((p_Var5->u).string.ptr,"full");
                uVar6 = iVar2 == 0 | 0xfffffffe;
              }
            }
            local_104.m_Value = uVar6;
            array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
            ::add(&local_f8.m_aConditions,&local_104);
          }
        }
        item = (char *)&local_f8;
        array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::add
                  (&local_d0.m_aRules,(CRule *)item);
        allocator_default<CTilesetMapper::CRuleCondition>::free_array(local_f8.m_aConditions.list);
      }
      array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_>::add
                (&this->m_aRuleSets,&local_d0);
      allocator_default<CTilesetMapper::CRule>::free_array(local_d0.m_aRules.list);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTilesetMapper::Load(const json_value &rElement)
{
	for(unsigned i = 0; i < rElement.u.array.length; ++i)
	{
		if(rElement[i].u.object.length != 1)
			continue;

		// new rule set
		CRuleSet NewRuleSet;
		const char* pConfName = rElement[i].u.object.values[0].name;
		str_copy(NewRuleSet.m_aName, pConfName, sizeof(NewRuleSet.m_aName));
		const json_value &rStart = *(rElement[i].u.object.values[0].value);

		// get basetile
		const json_value &rBasetile = rStart["basetile"];
		if(rBasetile.type == json_integer)
			NewRuleSet.m_BaseTile = clamp((int)rBasetile.u.integer, 0, 255);
		else
			NewRuleSet.m_BaseTile = 1;

		// get rules
		const json_value &rRuleNode = rStart["rules"];
		for(unsigned j = 0; j < rRuleNode.u.array.length && j < MAX_RULES; j++)
		{
			// create a new rule
			CRule NewRule;

			// index
			const json_value &rIndex = rRuleNode[j]["index"];
			if(rIndex.type == json_integer)
				NewRule.m_Index = clamp((int)rIndex.u.integer, 0, 255);
			else
				NewRule.m_Index = 1;

			// random
			const json_value &rRandom = rRuleNode[j]["random"];
			if(rRandom.type == json_integer)
				NewRule.m_Random = clamp((int)rRandom.u.integer, 0, 99999);
			else
				NewRule.m_Random = 0;

			// rotate
			const json_value &rRotate = rRuleNode[j]["rotate"];
			if(rRotate.type == json_integer && (rRotate.u.integer == 90 || rRotate.u.integer == 180 || rRotate.u.integer == 270))
				NewRule.m_Rotation = rRotate.u.integer;
			else
				NewRule.m_Rotation = 0;

			// hflip
			const json_value &rHFlip = rRuleNode[j]["hflip"];
			if(rHFlip.type == json_integer)
				NewRule.m_HFlip = clamp((int)rHFlip.u.integer, 0, 1);
			else
				NewRule.m_HFlip = 0;

			// vflip
			const json_value &rVFlip = rRuleNode[j]["vflip"];
			if(rVFlip.type == json_integer)
				NewRule.m_VFlip = clamp((int)rVFlip.u.integer, 0, 1);
			else
				NewRule.m_VFlip = 0;

			// get rule's content
			const json_value &rCondition = rRuleNode[j]["condition"];
			if(rCondition.type == json_array)
			{
				for(unsigned k = 0; k < rCondition.u.array.length; k++)
				{
					CRuleCondition Condition;

					Condition.m_X = rCondition[k]["x"].u.integer;
					Condition.m_Y = rCondition[k]["y"].u.integer;
					const json_value &rValue = rCondition[k]["value"];
					if(rValue.type == json_string)
					{
						// the value is not an index, check if it's full or empty
						if(str_comp((const char *)rValue, "full") == 0)
							Condition.m_Value = CRuleCondition::FULL;
						else
							Condition.m_Value = CRuleCondition::EMPTY;
					}
					else if(rValue.type == json_integer)
						Condition.m_Value = clamp((int)rValue.u.integer, (int)CRuleCondition::EMPTY, 255);
					else
						Condition.m_Value = CRuleCondition::EMPTY;

					NewRule.m_aConditions.add(Condition);
				}
			}

			NewRuleSet.m_aRules.add(NewRule);
		}

		m_aRuleSets.add(NewRuleSet);
	}
}